

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

string * __thiscall
fmt::format_abi_cxx11_(string *__return_storage_ptr__,fmt *this,CStringRef format_str,ArgList args)

{
  MemoryWriter w;
  BasicMemoryWriter<char,_std::allocator<char>_> local_230;
  
  local_230.super_BasicWriter<char>.buffer_ = &local_230.buffer_.super_Buffer<char>;
  local_230.super_BasicWriter<char>._vptr_BasicWriter =
       (_func_int **)&PTR__BasicMemoryWriter_002b01a0;
  local_230.buffer_.super_Buffer<char>.ptr_ = local_230.buffer_.data_;
  local_230.buffer_.super_Buffer<char>.size_ = 0;
  local_230.buffer_.super_Buffer<char>.capacity_ = 500;
  local_230.buffer_.super_Buffer<char>._vptr_Buffer = (_func_int **)&PTR_grow_002b01e8;
  BasicWriter<char>::write
            (&local_230.super_BasicWriter<char>,(int)this,format_str.data_,args.types_);
  BasicWriter<char>::str_abi_cxx11_(__return_storage_ptr__,&local_230.super_BasicWriter<char>);
  BasicMemoryWriter<char,_std::allocator<char>_>::~BasicMemoryWriter(&local_230);
  return __return_storage_ptr__;
}

Assistant:

explicit BasicMemoryWriter(const Allocator& alloc = Allocator())
    : BasicWriter<Char>(buffer_), buffer_(alloc) {}